

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# haxx_algebra.cxx
# Opt level: O1

void __thiscall HAXX_ALGEBRA::norm::test_method(norm *this)

{
  double *local_1e0;
  double *local_1d8;
  double local_1d0;
  undefined **local_1c8;
  undefined1 local_1c0;
  undefined8 *local_1b8;
  double **local_1b0;
  undefined **local_1a8;
  undefined1 local_1a0;
  undefined8 *local_198;
  double **local_190;
  double local_188;
  undefined1 local_180 [8];
  undefined8 local_178;
  shared_count sStack_170;
  char *local_168;
  char *local_160;
  double distDiff;
  double distQP;
  double distPQ;
  undefined **local_140;
  undefined1 local_138;
  undefined8 *local_130;
  char *local_128;
  double local_120;
  double nrm;
  undefined1 *local_110;
  undefined1 *local_108;
  char *local_100;
  char *local_f8;
  undefined1 *local_f0;
  undefined1 *local_e8;
  char *local_e0;
  char *local_d8;
  undefined1 *local_d0;
  undefined1 *local_c8;
  char *local_c0;
  char *local_b8;
  undefined1 *local_b0;
  undefined1 *local_a8;
  char *local_a0;
  char *local_98;
  undefined1 *local_90;
  undefined1 *local_88;
  char *local_80;
  char *local_78;
  undefined1 *local_70;
  undefined1 *local_68;
  char *local_60;
  char *local_58;
  undefined1 *local_50;
  undefined1 *local_48;
  char *local_40;
  char *local_38;
  
  nrm = 5.477225575051661;
  local_120 = 5.477225575051661;
  distPQ = 19.036935478432447;
  distQP = 19.036935478432447;
  distDiff = 10.599151866501584;
  local_40 = 
  "/workspace/llm4binary/github/license_c_cmakelists/wavefunction91[P]HAXX/tests/haxx_algebra.cxx";
  local_38 = "";
  local_50 = &boost::unit_test::basic_cstring<char_const>::null;
  local_48 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_40,0x3d);
  local_138 = 0;
  local_140 = &PTR__lazy_ostream_00151bb0;
  local_130 = &boost::unit_test::lazy_ostream::inst;
  local_128 = "";
  local_180[0] = nrm == local_120;
  local_178 = 0;
  sStack_170.pi_ = (sp_counted_base *)0x0;
  local_168 = 
  "/workspace/llm4binary/github/license_c_cmakelists/wavefunction91[P]HAXX/tests/haxx_algebra.cxx";
  local_160 = "";
  local_190 = &local_1d8;
  local_1a0 = 0;
  local_1a8 = &PTR__lazy_ostream_00151bf0;
  local_198 = &boost::unit_test::lazy_ostream::inst;
  local_1b0 = &local_1e0;
  local_1c0 = 0;
  local_1c8 = &PTR__lazy_ostream_00151bf0;
  local_1b8 = &boost::unit_test::lazy_ostream::inst;
  local_1e0 = &local_120;
  local_1d8 = &nrm;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_170);
  local_60 = 
  "/workspace/llm4binary/github/license_c_cmakelists/wavefunction91[P]HAXX/tests/haxx_algebra.cxx";
  local_58 = "";
  local_70 = &boost::unit_test::basic_cstring<char_const>::null;
  local_68 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_60,0x3e);
  local_138 = 0;
  local_140 = &PTR__lazy_ostream_00151bb0;
  local_130 = &boost::unit_test::lazy_ostream::inst;
  local_128 = "";
  local_1d8 = &distPQ;
  local_1e0 = &distQP;
  local_180[0] = distPQ == distQP;
  local_178 = 0;
  sStack_170.pi_ = (sp_counted_base *)0x0;
  local_168 = 
  "/workspace/llm4binary/github/license_c_cmakelists/wavefunction91[P]HAXX/tests/haxx_algebra.cxx";
  local_160 = "";
  local_1a0 = 0;
  local_1a8 = &PTR__lazy_ostream_00151bf0;
  local_198 = &boost::unit_test::lazy_ostream::inst;
  local_190 = &local_1d8;
  local_1c0 = 0;
  local_1c8 = &PTR__lazy_ostream_00151bf0;
  local_1b8 = &boost::unit_test::lazy_ostream::inst;
  local_1b0 = &local_1e0;
  boost::test_tools::tt_detail::report_assertion
            (local_180,&local_140,&local_168,0x3e,1,2,2,"distPQ",&local_1a8,"distQP",&local_1c8);
  boost::detail::shared_count::~shared_count(&sStack_170);
  local_80 = 
  "/workspace/llm4binary/github/license_c_cmakelists/wavefunction91[P]HAXX/tests/haxx_algebra.cxx";
  local_78 = "";
  local_90 = &boost::unit_test::basic_cstring<char_const>::null;
  local_88 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_80,0x3f);
  local_138 = 0;
  local_140 = &PTR__lazy_ostream_00151bb0;
  local_130 = &boost::unit_test::lazy_ostream::inst;
  local_128 = "";
  local_1e0 = &local_1d0;
  local_1d0 = 10.599151866501584;
  local_1d8 = &distDiff;
  local_180[0] = distDiff == 10.599151866501584;
  local_178 = 0;
  sStack_170.pi_ = (sp_counted_base *)0x0;
  local_168 = 
  "/workspace/llm4binary/github/license_c_cmakelists/wavefunction91[P]HAXX/tests/haxx_algebra.cxx";
  local_160 = "";
  local_1a0 = 0;
  local_1a8 = &PTR__lazy_ostream_00151bf0;
  local_198 = &boost::unit_test::lazy_ostream::inst;
  local_190 = &local_1d8;
  local_1c0 = 0;
  local_1c8 = &PTR__lazy_ostream_00151bf0;
  local_1b8 = &boost::unit_test::lazy_ostream::inst;
  local_1b0 = &local_1e0;
  boost::test_tools::tt_detail::report_assertion
            (local_180,&local_140,&local_168,0x3f,1,2,2,"distDiff",&local_1a8,"a*distP1Q1",
             &local_1c8);
  boost::detail::shared_count::~shared_count(&sStack_170);
  local_a0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/wavefunction91[P]HAXX/tests/haxx_algebra.cxx";
  local_98 = "";
  local_b0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_a8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_a0,0x41);
  local_138 = 0;
  local_140 = &PTR__lazy_ostream_00151bb0;
  local_130 = &boost::unit_test::lazy_ostream::inst;
  local_128 = "";
  local_1d0 = 1.0;
  local_1e0 = &local_188;
  local_188 = 1.0;
  local_180[0] = 1;
  local_178 = 0;
  sStack_170.pi_ = (sp_counted_base *)0x0;
  local_168 = 
  "/workspace/llm4binary/github/license_c_cmakelists/wavefunction91[P]HAXX/tests/haxx_algebra.cxx";
  local_160 = "";
  local_1d8 = &local_1d0;
  local_1a0 = 0;
  local_1a8 = &PTR__lazy_ostream_00151bf0;
  local_198 = &boost::unit_test::lazy_ostream::inst;
  local_190 = &local_1d8;
  local_1c0 = 0;
  local_1c8 = &PTR__lazy_ostream_00151bf0;
  local_1b8 = &boost::unit_test::lazy_ostream::inst;
  local_1b0 = &local_1e0;
  boost::test_tools::tt_detail::report_assertion
            (local_180,&local_140,&local_168,0x41,1,2,2,"q.real()",&local_1a8,"1.",&local_1c8);
  boost::detail::shared_count::~shared_count(&sStack_170);
  local_c0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/wavefunction91[P]HAXX/tests/haxx_algebra.cxx";
  local_b8 = "";
  local_d0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_c8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_c0,0x42);
  local_138 = 0;
  local_140 = &PTR__lazy_ostream_00151bb0;
  local_130 = &boost::unit_test::lazy_ostream::inst;
  local_128 = "";
  local_1d0 = 2.0;
  local_188 = 2.0;
  local_180[0] = 1;
  local_178 = 0;
  sStack_170.pi_ = (sp_counted_base *)0x0;
  local_168 = 
  "/workspace/llm4binary/github/license_c_cmakelists/wavefunction91[P]HAXX/tests/haxx_algebra.cxx";
  local_160 = "";
  local_1d8 = &local_1d0;
  local_1a0 = 0;
  local_1a8 = &PTR__lazy_ostream_00151bf0;
  local_198 = &boost::unit_test::lazy_ostream::inst;
  local_190 = &local_1d8;
  local_1e0 = &local_188;
  local_1c0 = 0;
  local_1c8 = &PTR__lazy_ostream_00151bf0;
  local_1b8 = &boost::unit_test::lazy_ostream::inst;
  local_1b0 = &local_1e0;
  boost::test_tools::tt_detail::report_assertion
            (local_180,&local_140,&local_168,0x42,1,2,2,"q.imag_i()",&local_1a8,"2.",&local_1c8);
  boost::detail::shared_count::~shared_count(&sStack_170);
  local_e0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/wavefunction91[P]HAXX/tests/haxx_algebra.cxx";
  local_d8 = "";
  local_f0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_e8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_e0,0x43);
  local_138 = 0;
  local_140 = &PTR__lazy_ostream_00151bb0;
  local_130 = &boost::unit_test::lazy_ostream::inst;
  local_128 = "";
  local_1d0 = 3.0;
  local_188 = 3.0;
  local_180[0] = 1;
  local_178 = 0;
  sStack_170.pi_ = (sp_counted_base *)0x0;
  local_168 = 
  "/workspace/llm4binary/github/license_c_cmakelists/wavefunction91[P]HAXX/tests/haxx_algebra.cxx";
  local_160 = "";
  local_1d8 = &local_1d0;
  local_1a0 = 0;
  local_1a8 = &PTR__lazy_ostream_00151bf0;
  local_198 = &boost::unit_test::lazy_ostream::inst;
  local_190 = &local_1d8;
  local_1e0 = &local_188;
  local_1c0 = 0;
  local_1c8 = &PTR__lazy_ostream_00151bf0;
  local_1b8 = &boost::unit_test::lazy_ostream::inst;
  local_1b0 = &local_1e0;
  boost::test_tools::tt_detail::report_assertion
            (local_180,&local_140,&local_168,0x43,1,2,2,"q.imag_j()",&local_1a8,"3.",&local_1c8);
  boost::detail::shared_count::~shared_count(&sStack_170);
  local_100 = 
  "/workspace/llm4binary/github/license_c_cmakelists/wavefunction91[P]HAXX/tests/haxx_algebra.cxx";
  local_f8 = "";
  local_110 = &boost::unit_test::basic_cstring<char_const>::null;
  local_108 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_100,0x44);
  local_138 = 0;
  local_140 = &PTR__lazy_ostream_00151bb0;
  local_130 = &boost::unit_test::lazy_ostream::inst;
  local_128 = "";
  local_1d0 = 4.0;
  local_188 = 4.0;
  local_180[0] = 1;
  local_178 = 0;
  sStack_170.pi_ = (sp_counted_base *)0x0;
  local_168 = 
  "/workspace/llm4binary/github/license_c_cmakelists/wavefunction91[P]HAXX/tests/haxx_algebra.cxx";
  local_160 = "";
  local_1d8 = &local_1d0;
  local_1a0 = 0;
  local_1a8 = &PTR__lazy_ostream_00151bf0;
  local_198 = &boost::unit_test::lazy_ostream::inst;
  local_190 = &local_1d8;
  local_1e0 = &local_188;
  local_1c0 = 0;
  local_1c8 = &PTR__lazy_ostream_00151bf0;
  local_1b8 = &boost::unit_test::lazy_ostream::inst;
  local_1b0 = &local_1e0;
  boost::test_tools::tt_detail::report_assertion
            (local_180,&local_140,&local_168,0x44,1,2,2,"q.imag_k()",&local_1a8,"4.",&local_1c8);
  boost::detail::shared_count::~shared_count(&sStack_170);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(norm)
{
  HAXX::quaternion<double> q(1.,2.,3.,4.);
  double nrm = HAXX::norm(q);
  double nrmStupid = 
    q.real() * q.real() +
    q.imag_i() * q.imag_i() +
    q.imag_j() * q.imag_j() +
    q.imag_k() * q.imag_k();

  nrmStupid = std::sqrt(nrmStupid);


  HAXX::quaternion<double> p(8.43,-9.3829,-10.3,3.14);
  HAXX::quaternion<double> q1(7.,2.43,3.65,7.006);
  HAXX::quaternion<double> p1(4.,2.,3.,7.);
  double a = 0.543;

  // Distance function
  double distPQ = HAXX::norm(p - q);
  double distQP = HAXX::norm(q - p);

  // Scaled distance
  double distP1Q1 = HAXX::norm(p1 + q1);
  double distDiff = HAXX::norm((p + a*p1 + q + a*q1) - (p + q));

  
  BOOST_CHECK_EQUAL(nrm,nrmStupid);
  BOOST_CHECK_EQUAL(distPQ,distQP);
  BOOST_CHECK_EQUAL(distDiff,a*distP1Q1);

  BOOST_CHECK_EQUAL(q.real(),  1.);
  BOOST_CHECK_EQUAL(q.imag_i(),2.);
  BOOST_CHECK_EQUAL(q.imag_j(),3.);
  BOOST_CHECK_EQUAL(q.imag_k(),4.);

}